

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
DictionaryInstance::op_associateValue_withKey
          (string *__return_storage_ptr__,DictionaryInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  mapped_type *pmVar1;
  undefined8 *puVar2;
  shared_ptr<Instance> key;
  shared_ptr<Instance> value;
  undefined1 auStack_38 [32];
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x40) {
    get_shared_instance((string *)(auStack_38 + 0x10),&this->_value_type);
    get_shared_instance((string *)auStack_38,&this->_key_type);
    pmVar1 = std::
             map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
             ::operator[](&this->_value,(key_type *)auStack_38);
    (pmVar1->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)auStack_38._16_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar1->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 0x18));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_38._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_38._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_38._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_38._24_8_);
    }
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string DictionaryInstance::op_associateValue_withKey(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> value = get_shared_instance(_value_type, arguments[0]);
    std::shared_ptr<Instance> key = get_shared_instance(_key_type, arguments[1]);
    _value[key] = value;
    return "null";
}